

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O1

int32_t message_client_connection_create(message_client_connection_t *self,uint8_t addressFamily)

{
  msocket_t *pmVar1;
  int32_t iVar2;
  undefined7 in_register_00000031;
  msocket_handler_t handler;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (self == (message_client_connection_t *)0x0) {
    iVar2 = 0;
  }
  else {
    self->pendingMessage = (adt_bytearray_t *)0x0;
    pmVar1 = (msocket_t *)msocket_new(addressFamily,CONCAT71(in_register_00000031,addressFamily));
    self->msocket = pmVar1;
    if (pmVar1 == (msocket_t *)0x0) {
      iVar2 = 1;
    }
    else {
      local_28 = 0;
      uStack_20 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = message_client_connection_onConnect;
      pcStack_30 = message_client_connection_onDisconnect;
      msocket_set_handler(pmVar1,&local_48,self);
      iVar2 = 0;
      sem_init((sem_t *)&self->messageTransmitted,0,0);
    }
  }
  return iVar2;
}

Assistant:

int32_t message_client_connection_create(message_client_connection_t *self, uint8_t addressFamily)
{
   if (self != 0)
   {
      self->pendingMessage = (adt_bytearray_t*) 0;
      self->msocket = msocket_new(addressFamily);
      if (self->msocket == 0)
      {
         return 1;
      }
      else
      {
         msocket_handler_t handler;
         memset(&handler, 0, sizeof(handler));
         handler.tcp_connected = message_client_connection_onConnect;
         handler.tcp_disconnected = message_client_connection_onDisconnect;
         msocket_sethandler(self->msocket, &handler, (void*) self);
         SEMAPHORE_CREATE(self->messageTransmitted);
      }
   }
   return 0;
}